

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

Result<wallet::CreatedTransactionResult> *
wallet::CreateTransaction
          (Result<wallet::CreatedTransactionResult> *__return_storage_ptr__,CWallet *wallet,
          vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *vecSend,
          optional<unsigned_int> change_pos,CCoinControl *coin_control,bool sign)

{
  undefined8 *puVar1;
  size_type *psVar2;
  pointer pCVar3;
  bool bVar4;
  T *pTVar5;
  T *pTVar6;
  pointer pCVar7;
  pointer pCVar8;
  long lVar9;
  long lVar10;
  char *parameters_2;
  long lVar11;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  CCoinControl tmp_cc;
  Result<wallet::CreatedTransactionResult> res;
  unique_lock<std::recursive_mutex> local_340;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_330;
  _Optional_payload_base<OutputType> local_2e0;
  undefined8 uStack_2d8;
  _Storage<CFeeRate,_true> local_2d0;
  undefined8 uStack_2c8;
  _Optional_payload_base<unsigned_int> local_2c0;
  bool bStack_2b6;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  FlatSigningProvider local_2a8;
  _Optional_payload_base<unsigned_int> local_1b0;
  _Optional_payload_base<unsigned_int> _Stack_1a8;
  _Optional_payload_base<int> local_1a0;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  _Stack_198;
  uint local_168;
  _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> local_160;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = (vecSend->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (vecSend->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar7 == pCVar3) {
    local_78 = &local_68;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Transaction must have at least one recipient","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Transaction must have at least one recipient","");
    }
    else {
      local_330._0_8_ =
           (long)"Unable to create transaction. Transaction must have at least one recipient" + 0x1e
      ;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_58,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_330);
    }
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     _M_u + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult> = puVar1;
    if (local_78 == &local_68) {
      *puVar1 = local_68;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
       0x18) = uStack_60;
    }
    else {
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult> = local_78;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
       0x10) = local_68;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u + 8)
         = local_70;
    psVar2 = (size_type *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                     _M_u + 0x30);
    *(size_type **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
     0x20) = psVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      *psVar2 = local_58.field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
       0x38) = local_58.field_2._8_8_;
    }
    else {
      *(pointer *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
       0x20) = local_58._M_dataplus._M_p;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
       0x30) = local_58.field_2._M_allocated_capacity;
    }
LAB_00c119f3:
    *(size_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
     0x28) = local_58._M_string_length;
    (__return_storage_ptr__->m_variant).
    super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
    super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
    super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
    super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
    super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
    super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index = '\0';
    goto LAB_00c119fe;
  }
  lVar10 = (long)pCVar3 - (long)pCVar7;
  lVar9 = (lVar10 >> 5) * -0x5555555555555555 >> 2;
  if (0 < lVar9) {
    lVar10 = lVar9 + 1;
    pCVar8 = pCVar7 + 2;
    do {
      if (pCVar8[-2].nAmount < 0) {
        pCVar8 = pCVar8 + -2;
        goto LAB_00c1169d;
      }
      if (pCVar8[-1].nAmount < 0) {
        pCVar8 = pCVar8 + -1;
        goto LAB_00c1169d;
      }
      if (pCVar8->nAmount < 0) goto LAB_00c1169d;
      if (pCVar8[1].nAmount < 0) {
        pCVar8 = pCVar8 + 1;
        goto LAB_00c1169d;
      }
      lVar10 = lVar10 + -1;
      pCVar8 = pCVar8 + 4;
    } while (1 < lVar10);
    lVar10 = (long)pCVar3 - (long)(pCVar7 + lVar9 * 4);
    pCVar7 = pCVar7 + lVar9 * 4;
  }
  lVar9 = (lVar10 >> 5) * -0x5555555555555555;
  if (lVar9 == 1) {
LAB_00c115ea:
    pCVar8 = pCVar7;
    if (-1 < pCVar7->nAmount) {
      pCVar8 = pCVar3;
    }
LAB_00c1169d:
    if (pCVar8 != pCVar3) {
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Transaction amounts must not be negative","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"Transaction amounts must not be negative","");
      }
      else {
        local_330._0_8_ = "Transaction amounts must not be negative";
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  (&local_98,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_330);
      }
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                       ._M_u + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult> = puVar1;
      if (local_b8 == &local_a8) {
        *puVar1 = local_a8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u
         + 0x18) = uStack_a0;
      }
      else {
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult> = local_b8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u
         + 0x10) = local_a8;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
       8) = local_b0;
      psVar2 = (size_type *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>
                       ._M_u + 0x30);
      *(size_type **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u +
       0x20) = psVar2;
      local_58._M_string_length = local_98._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        *psVar2 = local_98.field_2._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u
         + 0x38) = local_98.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u
         + 0x20) = local_98._M_dataplus._M_p;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_u
         + 0x30) = local_98.field_2._M_allocated_capacity;
      }
      goto LAB_00c119f3;
    }
  }
  else {
    if (lVar9 == 2) {
LAB_00c115df:
      pCVar8 = pCVar7;
      if (-1 < pCVar7->nAmount) {
        pCVar7 = pCVar7 + 1;
        goto LAB_00c115ea;
      }
      goto LAB_00c1169d;
    }
    if (lVar9 == 3) {
      pCVar8 = pCVar7;
      if (-1 < pCVar7->nAmount) {
        pCVar7 = pCVar7 + 1;
        goto LAB_00c115df;
      }
      goto LAB_00c1169d;
    }
  }
  local_340._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_340._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_340);
  CreateTransactionInternal
            ((Result<wallet::CreatedTransactionResult> *)&local_160,wallet,vecSend,change_pos,
             coin_control,sign);
  if ((((local_160._M_index == '\x01') &&
       (pTVar5 = util::Result<wallet::CreatedTransactionResult>::value
                           ((Result<wallet::CreatedTransactionResult> *)&local_160), 0 < pTVar5->fee
       )) && (-1 < wallet->m_max_aps_fee)) && (coin_control->m_avoid_partial_spends == false)) {
    std::__detail::__variant::
    _Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_330,
                      (_Copy_ctor_base<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)coin_control);
    local_2b0._0_4_ = coin_control->m_min_depth;
    local_2b0._4_4_ = coin_control->m_max_depth;
    local_2e0 = (coin_control->m_change_type).super__Optional_base<OutputType,_true,_true>.
                _M_payload.super__Optional_payload_base<OutputType>;
    uStack_2d8._0_1_ = coin_control->m_include_unsafe_inputs;
    uStack_2d8._1_1_ = coin_control->m_allow_other_inputs;
    uStack_2d8._2_1_ = coin_control->fAllowWatchOnly;
    uStack_2d8._3_1_ = coin_control->fOverrideFeeRate;
    uStack_2d8._4_4_ = *(undefined4 *)&coin_control->field_0x5c;
    local_2d0 = (coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
                super__Optional_payload_base<CFeeRate>._M_payload;
    uStack_2c8._0_1_ =
         (coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
         super__Optional_payload_base<CFeeRate>._M_engaged;
    uStack_2c8._1_7_ =
         *(undefined7 *)
          &(coin_control->m_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
           super__Optional_payload_base<CFeeRate>.field_0x9;
    local_2c0 = (coin_control->m_confirm_target).super__Optional_base<unsigned_int,_true,_true>.
                _M_payload.super__Optional_payload_base<unsigned_int>;
    uStack_2b8._0_2_ = (coin_control->m_signal_bip125_rbf).super__Optional_base<bool,_true,_true>;
    bStack_2b6 = coin_control->m_avoid_partial_spends;
    uStack_2b8._3_1_ = coin_control->m_avoid_address_reuse;
    uStack_2b8._4_4_ = coin_control->m_fee_mode;
    FlatSigningProvider::FlatSigningProvider(&local_2a8,&coin_control->m_external_provider);
    local_1a0 = (coin_control->m_max_tx_weight).super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int>;
    local_1b0 = (coin_control->m_locktime).super__Optional_base<unsigned_int,_true,_true>._M_payload
                .super__Optional_payload_base<unsigned_int>;
    _Stack_1a8 = (coin_control->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload
                 .super__Optional_payload_base<unsigned_int>;
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::_Rb_tree(&_Stack_198,&(coin_control->m_selected)._M_t);
    local_168 = coin_control->m_selection_pos;
    bStack_2b6 = true;
    if ((pTVar5->change_pos).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      ExtractDestination((CScript *)
                         ((long)(((pTVar5->tx).
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                          (ulong)(pTVar5->change_pos).super__Optional_base<unsigned_int,_true,_true>
                                 ._M_payload.super__Optional_payload_base<unsigned_int>._M_payload.
                                 _M_value * 0x28 + 8),(CTxDestination *)&local_330);
    }
    CreateTransactionInternal
              (__return_storage_ptr__,wallet,vecSend,change_pos,(CCoinControl *)&local_330,sign);
    if (((__return_storage_ptr__->m_variant).
         super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
         super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
         '\x01') &&
       (pTVar6 = util::Result<wallet::CreatedTransactionResult>::value(__return_storage_ptr__),
       (__return_storage_ptr__->m_variant).
       super__Variant_base<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Move_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Copy_assign_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Move_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Copy_ctor_alias<bilingual_str,_wallet::CreatedTransactionResult>.
       super__Variant_storage_alias<bilingual_str,_wallet::CreatedTransactionResult>._M_index ==
       '\x01')) {
      lVar9 = pTVar6->fee;
      lVar10 = pTVar5->fee;
      lVar11 = wallet->m_max_aps_fee + lVar10;
      pTVar5 = util::Result<wallet::CreatedTransactionResult>::value(__return_storage_ptr__);
      parameters_2 = "grouped";
      if (lVar11 < lVar9) {
        parameters_2 = "non-grouped";
      }
      CWallet::WalletLogPrintf<long,long,char_const*>
                (wallet,"Fee non-grouped = %lld, grouped = %lld, using %s\n",lVar10,pTVar5->fee,
                 parameters_2);
      if (lVar11 < lVar9) goto LAB_00c118d8;
      bVar4 = false;
    }
    else {
LAB_00c118d8:
      std::__detail::__variant::
      _Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>::~_Variant_storage
                ((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                 __return_storage_ptr__);
      bVar4 = true;
    }
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
    ::~_Rb_tree(&_Stack_198);
    std::
    _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
    ::~_Rb_tree(&local_2a8.tr_trees._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&local_2a8.keys._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
    ::~_Rb_tree(&local_2a8.origins._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
    ::~_Rb_tree(&local_2a8.pubkeys._M_t);
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&local_2a8.scripts._M_t);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_330);
    if (bVar4) goto LAB_00c1193d;
  }
  else {
LAB_00c1193d:
    std::__detail::__variant::
    _Move_ctor_base<false,_bilingual_str,_wallet::CreatedTransactionResult>::_Move_ctor_base
              ((_Move_ctor_base<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
               __return_storage_ptr__,
               (_Move_ctor_base<false,_bilingual_str,_wallet::CreatedTransactionResult> *)&local_160
              );
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage(&local_160);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_340);
LAB_00c119fe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<CreatedTransactionResult> CreateTransaction(
        CWallet& wallet,
        const std::vector<CRecipient>& vecSend,
        std::optional<unsigned int> change_pos,
        const CCoinControl& coin_control,
        bool sign)
{
    if (vecSend.empty()) {
        return util::Error{_("Transaction must have at least one recipient")};
    }

    if (std::any_of(vecSend.cbegin(), vecSend.cend(), [](const auto& recipient){ return recipient.nAmount < 0; })) {
        return util::Error{_("Transaction amounts must not be negative")};
    }

    LOCK(wallet.cs_wallet);

    auto res = CreateTransactionInternal(wallet, vecSend, change_pos, coin_control, sign);
    TRACE4(coin_selection, normal_create_tx_internal,
           wallet.GetName().c_str(),
           bool(res),
           res ? res->fee : 0,
           res && res->change_pos.has_value() ? int32_t(*res->change_pos) : -1);
    if (!res) return res;
    const auto& txr_ungrouped = *res;
    // try with avoidpartialspends unless it's enabled already
    if (txr_ungrouped.fee > 0 /* 0 means non-functional fee rate estimation */ && wallet.m_max_aps_fee > -1 && !coin_control.m_avoid_partial_spends) {
        TRACE1(coin_selection, attempting_aps_create_tx, wallet.GetName().c_str());
        CCoinControl tmp_cc = coin_control;
        tmp_cc.m_avoid_partial_spends = true;

        // Reuse the change destination from the first creation attempt to avoid skipping BIP44 indexes
        if (txr_ungrouped.change_pos) {
            ExtractDestination(txr_ungrouped.tx->vout[*txr_ungrouped.change_pos].scriptPubKey, tmp_cc.destChange);
        }

        auto txr_grouped = CreateTransactionInternal(wallet, vecSend, change_pos, tmp_cc, sign);
        // if fee of this alternative one is within the range of the max fee, we use this one
        const bool use_aps{txr_grouped.has_value() ? (txr_grouped->fee <= txr_ungrouped.fee + wallet.m_max_aps_fee) : false};
        TRACE5(coin_selection, aps_create_tx_internal,
               wallet.GetName().c_str(),
               use_aps,
               txr_grouped.has_value(),
               txr_grouped.has_value() ? txr_grouped->fee : 0,
               txr_grouped.has_value() && txr_grouped->change_pos.has_value() ? int32_t(*txr_grouped->change_pos) : -1);
        if (txr_grouped) {
            wallet.WalletLogPrintf("Fee non-grouped = %lld, grouped = %lld, using %s\n",
                txr_ungrouped.fee, txr_grouped->fee, use_aps ? "grouped" : "non-grouped");
            if (use_aps) return txr_grouped;
        }
    }
    return res;
}